

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

String * __thiscall
Jinx::Impl::Parser::ParseVariable_abi_cxx11_(String *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  bool bVar2;
  pointer pSVar3;
  bool local_75;
  ulong local_70;
  size_t i_1;
  bool exists;
  Symbol *local_50;
  size_t i;
  size_t symbolCount;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_38;
  SymbolListCItr curr;
  size_t s;
  size_t maxParts;
  Parser *local_18;
  Parser *this_local;
  String *name;
  
  local_75 = true;
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  if ((this->m_error & 1U) == 0) {
    maxParts = (size_t)std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                                 (this->m_symbolList);
    local_75 = __gnu_cxx::operator==
                         (&this->m_currentSymbol,
                          (__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                           *)&maxParts);
  }
  if (local_75 == false) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->(&this->m_currentSymbol);
    if (pSVar3->type == NameValue) {
      for (curr._M_current =
                (Symbol *)VariableStackFrame::GetMaxVariableParts(&this->m_variableStackFrame);
          curr._M_current != (Symbol *)0x0;
          curr._M_current = (Symbol *)((long)&curr._M_current[-1].columnNumber + 3)) {
        local_38._M_current = (this->m_currentSymbol)._M_current;
        bVar1 = false;
        pSVar3 = __gnu_cxx::
                 __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                 ::operator->(&local_38);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        basic_string(__return_storage_ptr__,&pSVar3->text);
        i = 1;
        for (local_50 = (Symbol *)0x1; local_50 < curr._M_current;
            local_50 = (Symbol *)((long)&local_50->type + 1)) {
          __gnu_cxx::
          __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
          ::operator++(&local_38);
          bVar2 = IsSymbolValid(this,(SymbolListCItr)local_38._M_current);
          if (bVar2) {
            pSVar3 = __gnu_cxx::
                     __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                     ::operator->(&local_38);
            bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                    ::empty(&pSVar3->text);
            if (!bVar2) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              operator+=(__return_storage_ptr__," ");
              pSVar3 = __gnu_cxx::
                       __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                       ::operator->(&local_38);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              operator+=(__return_storage_ptr__,&pSVar3->text);
              i = i + 1;
            }
          }
        }
        bVar2 = VariableExists(this,__return_storage_ptr__);
        if (bVar2) {
          for (local_70 = 0; local_70 < i; local_70 = local_70 + 1) {
            NextSymbol(this);
          }
          bVar1 = true;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        if (!bVar1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          ~basic_string(__return_storage_ptr__);
        }
        if (bVar2) {
          return __return_storage_ptr__;
        }
      }
      Error<>(this,"Could not parse variable name");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
                (__return_storage_ptr__);
    }
    else {
      Error<>(this,"Unexpected symbol type when parsing variable");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
                (__return_storage_ptr__);
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t String Parser::ParseVariable()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return String();
		if (m_currentSymbol->type != SymbolType::NameValue)
		{
			Error("Unexpected symbol type when parsing variable");
			return String();
		}

		// Check up to the max number of parts until we find a variable match
		auto maxParts = m_variableStackFrame.GetMaxVariableParts();
		for (size_t s = maxParts; s > 0; --s)
		{
			auto curr = m_currentSymbol;
			auto name = String(curr->text);
			size_t symbolCount = 1;
			for (size_t i = 1; i < s; ++i)
			{
				++curr;
				if (!IsSymbolValid(curr) || curr->text.empty())
					continue;
				name += " ";
				name += curr->text;
				++symbolCount;
			}
			bool exists = VariableExists(name);
			if (exists)
			{
				// Now that we know the longest variable count that matches, advance this number of symbols
				for (size_t i = 0; i < symbolCount; ++i)
					NextSymbol();

				// Return the variable name
				return name;
			}
		}
		Error("Could not parse variable name");
		return String();
	}